

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddApply.c
# Opt level: O0

DdNode * Cudd_addMinus(DdManager *dd,DdNode **f,DdNode **g)

{
  DdManager *f_00;
  double value;
  DdNode *G;
  DdNode *F;
  DdNode *res;
  DdNode **g_local;
  DdNode **f_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)*f;
  f_00 = (DdManager *)*g;
  if (dd_local == f_00) {
    dd_local = (DdManager *)dd->zero;
  }
  else if (dd_local == (DdManager *)dd->zero) {
    dd_local = (DdManager *)cuddAddNegateRecur(dd,(DdNode *)f_00);
  }
  else if (f_00 != (DdManager *)dd->zero) {
    if (((dd_local->sentinel).index == 0x7fffffff) && ((f_00->sentinel).index == 0x7fffffff)) {
      dd_local = (DdManager *)
                 cuddUniqueConst(dd,(dd_local->sentinel).type.value - (f_00->sentinel).type.value);
    }
    else {
      dd_local = (DdManager *)0x0;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_addMinus(
  DdManager * dd,
  DdNode ** f,
  DdNode ** g)
{
    DdNode *res;
    DdNode *F, *G;
    CUDD_VALUE_TYPE value;

    F = *f; G = *g;
    if (F == G) return(DD_ZERO(dd));
    if (F == DD_ZERO(dd)) return(cuddAddNegateRecur(dd,G));
    if (G == DD_ZERO(dd)) return(F);
    if (cuddIsConstant(F) && cuddIsConstant(G)) {
        value = cuddV(F)-cuddV(G);
        res = cuddUniqueConst(dd,value);
        return(res);
    }
    return(NULL);

}